

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O0

void cleanup_buffer_queue(list_head *q,_Bool destroy)

{
  list_head *__mptr;
  aura_buffer *b;
  list_head *tmp;
  list_head *pos;
  int i;
  _Bool destroy_local;
  list_head *q_local;
  
  pos._0_4_ = 0;
  tmp = q->next;
  b = (aura_buffer *)tmp->next;
  while (tmp != q) {
    list_del(tmp);
    if (destroy) {
      aura_buffer_destroy((aura_buffer *)(tmp + -2));
    }
    else {
      aura_buffer_release((aura_buffer *)(tmp + -2));
    }
    pos._0_4_ = (uint)pos + 1;
    tmp = (list_head *)b;
    b = *(aura_buffer **)b;
  }
  slog(6,1,"Cleaned up %d buffers",(ulong)(uint)pos);
  return;
}

Assistant:

static void cleanup_buffer_queue(struct list_head *q, bool destroy)
{
	int i = 0;

	struct list_head *pos, *tmp;

	list_for_each_safe(pos, tmp, q) {
		struct aura_buffer *b;

		b = list_entry(pos, struct aura_buffer, qentry);
		list_del(pos);
		if (!destroy)   /* Just return it to the pool */
			aura_buffer_release(b);
		else            /* Nuke it, we're closing down anyway*/
			aura_buffer_destroy(b);
		i++;
	}
	slog(6, SLOG_LIVE, "Cleaned up %d buffers", i);
}